

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadbase.c
# Opt level: O3

void checkAfkDist(afk_meta_t *d,int x,int z)

{
  uint z_00;
  int x_00;
  int *piVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  
  uVar2 = z | x;
  while( true ) {
    if ((((int)uVar2 < 0) || (d->w <= x)) || (d->h <= z)) {
      return;
    }
    piVar1 = d->buf;
    uVar2 = d->w * z + x;
    if (piVar1[uVar2] != 0) {
      return;
    }
    iVar3 = blocksInRange(d->p,d->n,d->x0 + x,d->z0 + z,d->ax,d->az,d->rsq);
    piVar1[(int)uVar2] = iVar3;
    if (iVar3 < d->best) break;
    if (d->best < iVar3) {
      d->best = iVar3;
      d->sumn = 1;
      d->sumx = (long)(d->x0 + x);
      lVar4 = (long)(d->z0 + z);
    }
    else {
      d->sumn = d->sumn + 1;
      d->sumx = d->sumx + (long)(d->x0 + x);
      lVar4 = (long)(d->z0 + z) + d->sumz;
    }
    d->sumz = lVar4;
    iVar3 = z - 1;
    checkAfkDist(d,x,iVar3);
    z_00 = z + 1;
    checkAfkDist(d,x,z_00);
    x_00 = x - 1;
    checkAfkDist(d,x_00,z);
    x = x + 1;
    checkAfkDist(d,x,z);
    checkAfkDist(d,x_00,iVar3);
    checkAfkDist(d,x_00,z_00);
    checkAfkDist(d,x,iVar3);
    uVar2 = z_00 | x;
    z = z_00;
  }
  return;
}

Assistant:

static void checkAfkDist(afk_meta_t *d, int x, int z)
{
    if (x < 0 || z < 0 || x >= d->w || z >= d->h)
        return;
    if (d->buf[z*d->w+x])
        return;

    int q = blocksInRange(d->p, d->n, x+d->x0, z+d->z0, d->ax, d->az, d->rsq);
    d->buf[z*d->w+x] = q;
    if (q >= d->best)
    {
        if (q > d->best)
        {
            d->best = q;
            d->sumn = 1;
            d->sumx = d->x0+x;
            d->sumz = d->z0+z;
        }
        else
        {
            d->sumn += 1;
            d->sumx += d->x0+x;
            d->sumz += d->z0+z;
        }
        checkAfkDist(d, x, z-1);
        checkAfkDist(d, x, z+1);
        checkAfkDist(d, x-1, z);
        checkAfkDist(d, x+1, z);
        checkAfkDist(d, x-1, z-1);
        checkAfkDist(d, x-1, z+1);
        checkAfkDist(d, x+1, z-1);
        checkAfkDist(d, x+1, z+1);
    }
}